

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall
leveldb::VersionSet::Builder::MaybeAddFile(Builder *this,Version *v,int level,FileMetaData *f)

{
  pointer *pppFVar1;
  pointer ppFVar2;
  FileMetaData *pFVar3;
  size_type sVar4;
  iterator __position;
  int iVar5;
  size_type sVar6;
  InternalKeyComparator *pIVar7;
  FileMetaData *local_48;
  pointer local_40;
  size_type local_38;
  pointer local_30;
  size_type local_28;
  
  local_48 = f;
  sVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::count
                    (&this->levels_[level].deleted_files,&f->number);
  if (sVar6 == 0) {
    if ((0 < level) &&
       (ppFVar2 = v->files_[level].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
       *(pointer *)(v->files_ + level) != ppFVar2)) {
      pFVar3 = ppFVar2[-1];
      sVar4 = (pFVar3->largest).rep_._M_string_length;
      if (sVar4 == 0) {
LAB_0011c3c5:
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.h"
                      ,0x94,"Slice leveldb::InternalKey::Encode() const");
      }
      local_40 = (pFVar3->largest).rep_._M_dataplus._M_p;
      local_28 = (f->smallest).rep_._M_string_length;
      local_38 = sVar4;
      if (local_28 == 0) goto LAB_0011c3c5;
      pIVar7 = &this->vset_->icmp_;
      local_30 = (f->smallest).rep_._M_dataplus._M_p;
      iVar5 = (*(pIVar7->super_Comparator)._vptr_Comparator[2])(pIVar7,&local_40);
      if (-1 < iVar5) {
        __assert_fail("vset_->icmp_.Compare((*files)[files->size() - 1]->largest, f->smallest) < 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                      ,0x2ea,
                      "void leveldb::VersionSet::Builder::MaybeAddFile(Version *, int, FileMetaData *)"
                     );
      }
    }
    f->refs = f->refs + 1;
    __position._M_current =
         v->files_[level].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        v->files_[level].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>::
      _M_realloc_insert<leveldb::FileMetaData*const&>
                ((vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>> *)
                 (v->files_ + level),__position,&local_48);
    }
    else {
      *__position._M_current = f;
      pppFVar1 = &v->files_[level].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
  }
  return;
}

Assistant:

void MaybeAddFile(Version* v, int level, FileMetaData* f) {
    if (levels_[level].deleted_files.count(f->number) > 0) {
      // File is deleted: do nothing
    } else {
      std::vector<FileMetaData*>* files = &v->files_[level];
      if (level > 0 && !files->empty()) {
        // Must not overlap
        assert(vset_->icmp_.Compare((*files)[files->size() - 1]->largest,
                                    f->smallest) < 0);
      }
      f->refs++;
      files->push_back(f);
    }
  }